

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

void reduce_one(Parser *p,Reduction *r)

{
  long lVar1;
  uint32 *puVar2;
  SNode *ps;
  VecZNode *pVVar3;
  SNode *pSVar4;
  SNode **ppSVar5;
  ZNode **ppZVar6;
  ZNode *pZVar7;
  ZNode *pZVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  PNode *pPVar12;
  PNode *pn2;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  D_Reduction *r_00;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  VecVecZNode paths;
  PNode *local_c8;
  ulong local_a8;
  VecVecZNode local_88;
  ulong local_60;
  SNode **local_58;
  ZNode **local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  ps = r->snode;
  r_00 = r->reduction;
  if (r->znode == (ZNode *)0x0) {
    pPVar12 = add_PNode(p,(uint)r_00->symbol,&ps->loc,(ps->loc).s,ps->last_pn,r_00,(VecZNode *)0x0,
                        (D_Shift *)0x0);
    if (pPVar12 != (PNode *)0x0) {
      goto_PNode(p,&ps->loc,pPVar12,ps);
    }
  }
  else {
    uVar13 = (uint)r_00->nelements;
    local_88.n = 0;
    local_88.v = (VecZNode **)0x0;
    if (r_00->nelements != 0) {
      path1.n = 0;
      path1.v = (ZNode **)0x0;
      local_88.v = local_88.e;
      local_88.n = 1;
      local_88.e[0] = &path1;
      build_paths_internal(r->znode,&local_88,0,uVar13,uVar13);
    }
    if (local_88.n != 0) {
      local_38 = (ulong)(uVar13 - 1);
      uVar16 = 0;
      do {
        pVVar3 = local_88.v[uVar16];
        pSVar4 = r->new_snode;
        if (pSVar4 == (SNode *)0x0) {
LAB_00147bc3:
          uVar13 = pVVar3->n;
          if (1 < uVar13) {
            ppZVar6 = pVVar3->v;
            local_c8 = (*ppZVar6)->pn;
            lVar14 = 0;
            if (local_c8->op_assoc == ASSOC_NONE) {
              if (ppZVar6[1]->pn->op_assoc != ASSOC_NONE) {
                pPVar12 = ppZVar6[1]->pn;
                if (pPVar12->op_assoc != ASSOC_NONE) {
                  if (local_c8->assoc == ASSOC_NONE) {
                    lVar14 = 1;
                    local_c8 = pPVar12;
                  }
                  else {
                    lVar14 = 1;
                    iVar11 = check_child(pPVar12->op_priority,pPVar12->op_assoc,local_c8->priority,
                                         local_c8->assoc,1,(int)r_00);
                    local_c8 = pPVar12;
                    if (iVar11 == 0) goto LAB_00147eaa;
                  }
                  goto LAB_00147bf4;
                }
              }
            }
            else {
LAB_00147bf4:
              uVar10 = (uint)lVar14 + 1;
              if (uVar10 < uVar13) {
                pZVar7 = ppZVar6[uVar10];
                pPVar12 = pZVar7->pn;
                uVar10 = (uint)lVar14 | 2;
                if (uVar10 < uVar13) {
                  pn2 = ppZVar6[uVar10]->pn;
                }
                else {
                  uVar18 = (ulong)(pZVar7->sns).n;
                  if (uVar18 != 0) {
                    ppSVar5 = (pZVar7->sns).v;
                    uVar15 = 0;
                    bVar20 = false;
                    do {
                      pSVar4 = ppSVar5[uVar15];
                      uVar19 = (ulong)(pSVar4->zns).n;
                      if (uVar19 != 0) {
                        ppZVar6 = (pSVar4->zns).v;
                        uVar17 = 0;
                        do {
                          pZVar7 = ppZVar6[uVar17];
                          if ((pZVar7 != (ZNode *)0x0) &&
                             (iVar11 = check_assoc_priority(local_c8,pPVar12,pZVar7->pn),
                             iVar11 == 0)) goto LAB_00147e1b;
                          uVar17 = uVar17 + 1;
                        } while (uVar19 != uVar17);
                        bVar20 = true;
                      }
                      uVar15 = uVar15 + 1;
                    } while (uVar15 != uVar18);
                    if (bVar20) goto LAB_00147eaa;
                  }
                  pn2 = (PNode *)0x0;
                }
                iVar11 = check_assoc_priority(local_c8,pPVar12,pn2);
                if (iVar11 != 0) goto LAB_00147eaa;
              }
              else {
                local_60 = (ulong)(ppZVar6[lVar14]->sns).n;
                if (local_60 != 0) {
                  local_58 = (ppZVar6[lVar14]->sns).v;
                  local_a8 = 0;
                  do {
                    local_48 = (ulong)(local_58[local_a8]->zns).n;
                    if (local_48 != 0) {
                      local_50 = (local_58[local_a8]->zns).v;
                      uVar18 = 0;
                      do {
                        pZVar7 = local_50[uVar18];
                        local_40 = uVar18;
                        if ((pZVar7 != (ZNode *)0x0) &&
                           (uVar18 = (ulong)(pZVar7->sns).n, uVar18 != 0)) {
                          ppSVar5 = (pZVar7->sns).v;
                          uVar15 = 0;
                          do {
                            pSVar4 = ppSVar5[uVar15];
                            uVar19 = (ulong)(pSVar4->zns).n;
                            if (uVar19 != 0) {
                              ppZVar6 = (pSVar4->zns).v;
                              uVar17 = 0;
                              do {
                                pZVar8 = ppZVar6[uVar17];
                                if ((pZVar8 != (ZNode *)0x0) &&
                                   (iVar11 = check_assoc_priority(local_c8,pZVar7->pn,pZVar8->pn),
                                   iVar11 == 0)) goto LAB_00147e1b;
                                uVar17 = uVar17 + 1;
                              } while (uVar19 != uVar17);
                            }
                            uVar15 = uVar15 + 1;
                          } while (uVar15 != uVar18);
                        }
                        uVar18 = local_40 + 1;
                      } while (uVar18 != local_48);
                    }
                    local_a8 = local_a8 + 1;
                  } while (local_a8 != local_60);
                }
              }
            }
          }
LAB_00147e1b:
          p->reductions = p->reductions + 1;
          pZVar7 = pVVar3->v[local_38];
          r_00 = r->reduction;
          pPVar12 = add_PNode(p,(uint)r_00->symbol,&(pZVar7->pn->parse_node).start_loc,(ps->loc).s,
                              (*pVVar3->v)->pn,r_00,pVVar3,(D_Shift *)0x0);
          if ((pPVar12 != (PNode *)0x0) && ((pZVar7->sns).n != 0)) {
            uVar18 = 0;
            do {
              goto_PNode(p,&ps->loc,pPVar12,(pZVar7->sns).v[uVar18]);
              uVar18 = uVar18 + 1;
            } while (uVar18 < (pZVar7->sns).n);
          }
        }
        else {
          uVar13 = (pVVar3->v[r->new_depth]->sns).n;
          bVar20 = uVar13 != 0;
          if (bVar20) {
            ppSVar5 = (pVVar3->v[r->new_depth]->sns).v;
            if (*ppSVar5 != pSVar4) {
              lVar14 = 0;
              do {
                if (uVar13 - 1 == (int)lVar14) goto LAB_00147eaa;
                lVar1 = lVar14 + 1;
                lVar9 = lVar14 + 1;
                lVar14 = lVar1;
              } while (ppSVar5[lVar9] != pSVar4);
              bVar20 = (uint)lVar1 < uVar13;
            }
            if (bVar20) goto LAB_00147bc3;
          }
        }
LAB_00147eaa:
        uVar16 = uVar16 + 1;
      } while (uVar16 < local_88.n);
      if (local_88.n != 0) {
        uVar16 = 0;
        do {
          ppZVar6 = local_88.v[uVar16]->v;
          if (ppZVar6 != local_88.v[uVar16]->e && ppZVar6 != (ZNode **)0x0) {
            free(ppZVar6);
          }
          pVVar3 = local_88.v[uVar16];
          pVVar3->n = 0;
          pVVar3->v = (ZNode **)0x0;
          if (local_88.v[uVar16] != &path1) {
            free(local_88.v[uVar16]);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < local_88.n);
      }
    }
    if (local_88.v != local_88.e && local_88.v != (VecZNode **)0x0) {
      free(local_88.v);
    }
    local_88.n = 0;
    local_88.v = (VecZNode **)0x0;
  }
  puVar2 = &ps->refcount;
  *puVar2 = *puVar2 - 1;
  if (*puVar2 == 0) {
    free_SNode(p,ps);
  }
  r->next = p->free_reductions;
  p->free_reductions = r;
  return;
}

Assistant:

static void reduce_one(Parser *p, Reduction *r) {
  SNode *sn = r->snode;
  PNode *pn, *last_pn;
  ZNode *first_z;
  uint i, j, n = r->reduction->nelements;
  VecVecZNode paths;
  VecZNode *path;

  if (!r->znode) { /* epsilon reduction */
    if ((pn = add_PNode(p, r->reduction->symbol, &sn->loc, sn->loc.s, sn->last_pn, r->reduction, 0, 0)))
      goto_PNode(p, &sn->loc, pn, sn);
  } else {
    DBG(printf("reduce %d %p %d\n", (int)(r->snode->state - p->t->state), (void *)sn, n));
    vec_clear(&paths);
    build_paths(r->znode, &paths, n);
    for (i = 0; i < paths.n; i++) {
      path = paths.v[i];
      if (r->new_snode) { /* prune paths by new right epsilon node */
        for (j = 0; j < path->v[r->new_depth]->sns.n; j++)
          if (path->v[r->new_depth]->sns.v[j] == r->new_snode) break;
        if (j >= path->v[r->new_depth]->sns.n) continue;
      }
      if (check_path_priorities(path)) continue;
      p->reductions++;
      last_pn = path->v[0]->pn;
      first_z = path->v[n - 1];
      pn = add_PNode(p, r->reduction->symbol, &first_z->pn->parse_node.start_loc, sn->loc.s, last_pn, r->reduction,
                     path, NULL);
      if (pn)
        for (j = 0; j < first_z->sns.n; j++) goto_PNode(p, &sn->loc, pn, first_z->sns.v[j]);
    }
    free_paths(&paths);
  }
  unref_sn(p, sn);
  r->next = p->free_reductions;
  p->free_reductions = r;
}